

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

void * __thiscall
std::pmr::local_malloc_free_resource::malloc_free_resource::do_allocate
          (malloc_free_resource *this,size_t bytes,size_t alignment)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = malloc(bytes);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = __dynamic_cast;
  __cxa_throw(puVar2,&bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

[[nodiscard]] void *
            do_allocate(size_t bytes, size_t alignment) override
        {
            // While this class is local, there is no need to check the
            // alignment, as we never ask for overaligned memory
            //if (alignment > alignof(max_align_t)) {
            //    throw bad_alloc();
            //}
            void *rv = malloc(bytes);
            if (nullptr == rv) {
                throw bad_alloc();
            }
            return rv;
        }